

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3SegReaderSort(Fts3SegReader **apSegment,int nSegment,int nSuspect,
                      _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *xCmp)

{
  Fts3SegReader *pFVar1;
  int iVar2;
  Fts3SegReader *pTmp;
  int j;
  int i;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *xCmp_local;
  int nSuspect_local;
  int nSegment_local;
  Fts3SegReader **apSegment_local;
  
  if (nSuspect == nSegment) {
    nSuspect = nSuspect + -1;
  }
  while (pTmp._4_4_ = nSuspect + -1, -1 < pTmp._4_4_) {
    pTmp._0_4_ = pTmp._4_4_;
    while ((nSuspect = pTmp._4_4_, (int)pTmp < nSegment + -1 &&
           (iVar2 = (*xCmp)(apSegment[(int)pTmp],apSegment[(int)pTmp + 1]), -1 < iVar2))) {
      pFVar1 = apSegment[(int)pTmp + 1];
      apSegment[(int)pTmp + 1] = apSegment[(int)pTmp];
      apSegment[(int)pTmp] = pFVar1;
      pTmp._0_4_ = (int)pTmp + 1;
    }
  }
  return;
}

Assistant:

static void fts3SegReaderSort(
  Fts3SegReader **apSegment,                     /* Array to sort entries of */
  int nSegment,                                  /* Size of apSegment array */
  int nSuspect,                                  /* Unsorted entry count */
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *)  /* Comparison function */
){
  int i;                          /* Iterator variable */

  assert( nSuspect<=nSegment );

  if( nSuspect==nSegment ) nSuspect--;
  for(i=nSuspect-1; i>=0; i--){
    int j;
    for(j=i; j<(nSegment-1); j++){
      Fts3SegReader *pTmp;
      if( xCmp(apSegment[j], apSegment[j+1])<0 ) break;
      pTmp = apSegment[j+1];
      apSegment[j+1] = apSegment[j];
      apSegment[j] = pTmp;
    }
  }

#ifndef NDEBUG
  /* Check that the list really is sorted now. */
  for(i=0; i<(nSuspect-1); i++){
    assert( xCmp(apSegment[i], apSegment[i+1])<0 );
  }
#endif
}